

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# branching.cpp
# Opt level: O2

void branch(vec<Branching_*> *x,VarBranch var_branch,ValBranch val_branch)

{
  BranchGroup *pBVar1;
  BranchGroup *pBVar2;
  vec<Branching_*> local_30;
  
  pBVar1 = engine.branching;
  vec<Branching*>::vec<Branching*>((vec<Branching*> *)&local_30,x);
  pBVar2 = createBranch(&local_30,var_branch,val_branch);
  (*(pBVar1->super_Branching)._vptr_Branching[3])(pBVar1,pBVar2);
  free(local_30.data);
  return;
}

Assistant:

void branch(vec<Branching*> x, VarBranch var_branch, ValBranch val_branch) {
	engine.branching->add(createBranch(x, var_branch, val_branch));
}